

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

ConductorMaterial *
pbrt::ConductorMaterial::Create(TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator<char> local_89;
  FloatTextureHandle displacement;
  string local_80;
  FloatTextureHandle vRoughness;
  SpectrumTextureHandle k;
  FloatTextureHandle uRoughness;
  pbrt local_30 [8];
  pbrt local_28 [8];
  SpectrumTextureHandle eta;
  ConductorMaterial *pCVar3;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"eta",(allocator<char> *)&k);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uRoughness,"metal-Cu-eta",(allocator<char> *)&vRoughness);
  GetNamedSpectrum(local_28,(string *)&uRoughness);
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)&eta,(string *)parameters,(SpectrumHandle *)&local_80,
             (SpectrumType)local_28,(Allocator)0x1);
  std::__cxx11::string::~string((string *)&uRoughness);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"k",(allocator<char> *)&vRoughness);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uRoughness,"metal-Cu-k",(allocator<char> *)&displacement);
  GetNamedSpectrum(local_30,(string *)&uRoughness);
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)&k,(string *)parameters,(SpectrumHandle *)&local_80,
             (SpectrumType)local_30,(Allocator)0x1);
  std::__cxx11::string::~string((string *)&uRoughness);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"uroughness",(allocator<char> *)&vRoughness);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&uRoughness,(string *)parameters,
             (memory_resource *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"vroughness",(allocator<char> *)&displacement);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&vRoughness,(string *)parameters,
             (memory_resource *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (((ulong)uRoughness.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits & 0xffffffffffff) == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"roughness",&local_89);
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)&displacement,(string *)parameters,0.0,
               (memory_resource *)&local_80);
    uRoughness = displacement;
    std::__cxx11::string::~string((string *)&local_80);
  }
  if (((ulong)vRoughness.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits & 0xffffffffffff) == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"roughness",&local_89);
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)&displacement,(string *)parameters,0.0,
               (memory_resource *)&local_80);
    vRoughness = displacement;
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"displacement",&local_89);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&displacement,(string *)parameters,
             (memory_resource *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"remaproughness",&local_89)
  ;
  bVar1 = TextureParameterDictionary::GetOneBool(parameters,&local_80,true);
  std::__cxx11::string::~string((string *)&local_80);
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x30,8);
  pCVar3 = (ConductorMaterial *)CONCAT44(extraout_var,iVar2);
  (pCVar3->displacement).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)
          displacement.
          super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
          .bits;
  (pCVar3->eta).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (uintptr_t)
          eta.
          super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  (pCVar3->k).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (uintptr_t)
          k.
          super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  (pCVar3->uRoughness).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)
          uRoughness.
          super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
          .bits;
  (pCVar3->vRoughness).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)
          vRoughness.
          super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
          .bits;
  pCVar3->remapRoughness = bVar1;
  return pCVar3;
}

Assistant:

ConductorMaterial *ConductorMaterial::Create(const TextureParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    SpectrumTextureHandle eta = parameters.GetSpectrumTexture(
        "eta", GetNamedSpectrum("metal-Cu-eta"), SpectrumType::General, alloc);
    SpectrumTextureHandle k = parameters.GetSpectrumTexture(
        "k", GetNamedSpectrum("metal-Cu-k"), SpectrumType::General, alloc);

    FloatTextureHandle uRoughness = parameters.GetFloatTextureOrNull("uroughness", alloc);
    FloatTextureHandle vRoughness = parameters.GetFloatTextureOrNull("vroughness", alloc);
    if (!uRoughness)
        uRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);
    if (!vRoughness)
        vRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);

    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);
    return alloc.new_object<ConductorMaterial>(eta, k, uRoughness, vRoughness,
                                               displacement, remapRoughness);
}